

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask30_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar12 [64];
  
  auVar2 = vpmovsxbd_avx2(ZEXT816(0x100e0c0a08060402));
  auVar7 = vpmovsxbd_avx512f(_DAT_00187950);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(in + 0xd);
  auVar3 = vpsrlvd_avx2(auVar14,_DAT_00196530);
  auVar4 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 9),_DAT_00193f00);
  auVar5 = vpsrlvd_avx2(*(undefined1 (*) [32])(in + 1),auVar2);
  auVar8 = vinserti32x4_avx512f
                     (ZEXT3264(*(undefined1 (*) [32])(in + 1)),*(undefined1 (*) [16])(in + 9),2);
  auVar9 = vpbroadcastd_avx512f();
  auVar8 = vinserti32x4_avx512f(auVar8,auVar14,3);
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0xf]));
  auVar13._56_4_ = auVar10._56_4_;
  auVar7 = vpermi2d_avx512f(auVar7,ZEXT3264(auVar5),ZEXT464(*in));
  auVar10 = vpmovsxbd_avx512f(_DAT_00187960);
  auVar11 = vpmovsxbd_avx512f(_DAT_00187930);
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_56_ = auVar8._0_56_;
  auVar13._60_4_ = auVar12._60_4_;
  auVar8 = vpsllvd_avx512f(auVar13,_DAT_001a2f80);
  uVar1 = *(ulong *)(in + 0x16);
  auVar7 = vpermi2d_avx512f(auVar10,auVar7,ZEXT1664(auVar4));
  auVar7 = vpermi2d_avx512f(auVar11,auVar7,ZEXT1664(auVar3));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x2010004));
  auVar10 = vpbroadcastd_avx512f(ZEXT416(in[0x10]));
  auVar10._0_60_ = auVar7._0_60_;
  auVar7 = vpord_avx512f(auVar8,auVar10);
  auVar7 = vmovdqu64_avx512f(auVar7);
  *(undefined1 (*) [64])out = auVar7;
  auVar3 = *(undefined1 (*) [16])(in + 0x12);
  auVar6 = vpermi2d_avx512vl(auVar4,auVar3,auVar9._0_16_);
  auVar4 = vpsllvd_avx2(auVar3,_DAT_001a13c0);
  auVar6 = vpsrlvd_avx2(auVar6,auVar2._0_16_);
  auVar4 = vpor_avx(auVar4,auVar6);
  *(undefined1 (*) [16])(out + 0x10) = auVar4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar3 = vpalignr_avx(auVar6,auVar3,0xc);
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_001a0ab0);
  auVar3 = vpsllvd_avx2(auVar6,_DAT_001a13d0);
  auVar3 = vpor_avx(auVar3,auVar4);
  *(long *)(out + 0x14) = auVar3._0_8_;
  out[0x16] = (uint)(uVar1 >> 0x2e);
  return out + 0x17;
}

Assistant:

uint32_t *__fastpackwithoutmask30_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (30 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (30 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (30 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (30 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (30 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (30 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (30 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (30 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (30 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (30 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (30 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (30 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  *out = ((*in)) >> (30 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  *out = ((*in)) >> (30 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (30 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (30 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (30 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (30 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (30 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (30 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (30 - 16);
  ++in;

  return out + 1;
}